

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module * lys_implemented_module(lys_module *mod)

{
  ly_ctx *plVar1;
  int local_24;
  int i;
  ly_ctx *ctx;
  lys_module *mod_local;
  
  if ((mod != (lys_module *)0x0) && ((*(ushort *)&mod->field_0x40 >> 7 & 1) == 0)) {
    plVar1 = mod->ctx;
    for (local_24 = 0; local_24 < (plVar1->models).used; local_24 = local_24 + 1) {
      if (((*(ushort *)&(plVar1->models).list[local_24]->field_0x40 >> 7 & 1) != 0) &&
         (mod->name == (plVar1->models).list[local_24]->name)) {
        return (plVar1->models).list[local_24];
      }
    }
  }
  return mod;
}

Assistant:

lys_module *
lys_implemented_module(const struct lys_module *mod)
{
    struct ly_ctx *ctx;
    int i;

    if (!mod || mod->implemented) {
        /* invalid argument or the module itself is implemented */
        return (struct lys_module *)mod;
    }

    ctx = mod->ctx;
    for (i = 0; i < ctx->models.used; i++) {
        if (!ctx->models.list[i]->implemented) {
            continue;
        }

        if (ly_strequal(mod->name, ctx->models.list[i]->name, 1)) {
            /* we have some revision of the module implemented */
            return ctx->models.list[i];
        }
    }

    /* we have no revision of the module implemented, return the module itself,
     * it is up to the caller to set the module implemented when needed */
    return (struct lys_module *)mod;
}